

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O1

void __thiscall
glcts::TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char>::deinit
          (TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char> *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0xb8))(0xde1,0);
  (**(code **)(lVar2 + 0xb8))(0x8c1a,0);
  (**(code **)(lVar2 + 0xb8))(0x806f,0);
  (**(code **)(lVar2 + 0x40))(0x8892,0);
  (**(code **)(lVar2 + 0xa8))(0,0);
  (**(code **)(lVar2 + 0x78))(0x8ca9,0);
  (**(code **)(lVar2 + 0x78))(0x8ca8,0);
  (**(code **)(lVar2 + 0xd8))(0);
  if (this->m_attr_position_location != -1) {
    (**(code **)(lVar2 + 0x518))();
    this->m_attr_position_location = -1;
  }
  if (this->m_attr_texcoord_location != -1) {
    (**(code **)(lVar2 + 0x518))();
    this->m_attr_texcoord_location = -1;
  }
  (**(code **)(lVar2 + 0x1680))(0);
  if (this->m_fbo_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo_id);
    this->m_fbo_id = 0;
  }
  if (this->m_po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_po_id = 0;
  }
  if (this->m_fs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_fs_id = 0;
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_vs_id = 0;
  }
  if (this->m_input_to_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_input_to_id);
    this->m_input_to_id = 0;
  }
  if (this->m_output_to_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_output_to_id);
    this->m_output_to_id = 0;
  }
  if (this->m_sampler_id != 0) {
    (**(code **)(lVar2 + 0x468))(1,&this->m_sampler_id);
    this->m_sampler_id = 0;
  }
  if (this->m_position_vbo_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_position_vbo_id);
    this->m_position_vbo_id = 0;
  }
  if (this->m_text_coord_vbo_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_text_coord_vbo_id);
    this->m_text_coord_vbo_id = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureBorderClampSamplingTexture<InputType, OutputType>::deinit(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset Gl state */
	gl.bindTexture(GL_TEXTURE_2D, 0);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, 0);
	gl.bindTexture(GL_TEXTURE_3D, 0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	gl.bindSampler(m_texture_unit, 0);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, 0);
	gl.bindVertexArray(0);

	if (m_attr_position_location != -1)
	{
		gl.disableVertexAttribArray(m_attr_position_location);
		m_attr_position_location = -1;
	}

	if (m_attr_texcoord_location != -1)
	{
		gl.disableVertexAttribArray(m_attr_texcoord_location);
		m_attr_texcoord_location = -1;
	}

	gl.useProgram(0);

	/* Delete Gl objects */
	if (m_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);
		m_fbo_id = 0;
	}

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);
		m_po_id = 0;
	}

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);
		m_fs_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);
		m_vs_id = 0;
	}

	if (m_input_to_id != 0)
	{
		gl.deleteTextures(1, &m_input_to_id);
		m_input_to_id = 0;
	}

	if (m_output_to_id != 0)
	{
		gl.deleteTextures(1, &m_output_to_id);
		m_output_to_id = 0;
	}

	if (m_sampler_id != 0)
	{
		gl.deleteSamplers(1, &m_sampler_id);
		m_sampler_id = 0;
	}

	if (m_position_vbo_id != 0)
	{
		gl.deleteBuffers(1, &m_position_vbo_id);
		m_position_vbo_id = 0;
	}

	if (m_text_coord_vbo_id != 0)
	{
		gl.deleteBuffers(1, &m_text_coord_vbo_id);
		m_text_coord_vbo_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);
		m_vao_id = 0;
	}

	/* Deinitialize base class */
	TestCaseBase::deinit();
}